

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O0

llama_model *
llama_model_load_from_file_impl
          (string *path_model,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,llama_model_params params)

{
  bool bVar1;
  int iVar2;
  _func_bool_float_void_ptr *p_Var3;
  llama_model *plVar4;
  const_iterator __position;
  char *__s;
  allocator<char> *__a;
  size_type sVar5;
  reference ppgVar6;
  reference ppgVar7;
  undefined8 uVar8;
  int status;
  size_t total;
  size_t free;
  ggml_backend_device *dev_2;
  iterator __end1;
  iterator __begin1;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *__range1;
  ggml_backend_dev_t main_gpu;
  ggml_backend_reg_t reg;
  ggml_backend_dev_t dev_1;
  size_t i;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> rpc_servers;
  ggml_backend_dev_t *dev;
  llama_model_params *in_stack_00000140;
  llama_model *in_stack_00000148;
  llama_model *model;
  string *in_stack_00000158;
  uint cur_percentage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint uVar9;
  int in_stack_fffffffffffffe94;
  value_type *in_stack_fffffffffffffe98;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
  __first;
  llama_model_params *params_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 local_f8 [8];
  ulong local_f0;
  ggml_backend_device *local_e8;
  ggml_backend_device **local_e0;
  __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
  local_d8;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *local_d0;
  value_type local_c8;
  ggml_backend_device **local_c0;
  allocator<char> local_91;
  string local_90 [32];
  char *local_70;
  ggml_backend_device **local_68;
  ggml_backend_device **local_60;
  value_type local_58 [3];
  ggml_backend_dev_t *local_40;
  llama_model *local_28;
  __0 local_1d;
  undefined4 local_1c [5];
  llama_model *local_8;
  
  params_00 = (llama_model_params *)&stack0x00000008;
  ggml_time_init();
  local_1c[0] = 0;
  if (params_00->progress_callback == (llama_progress_callback)0x0) {
    params_00->progress_callback_user_data = local_1c;
    p_Var3 = llama_model_load_from_file_impl(std::__cxx11::string_const&,std::vector&,llama_model_params)
             ::$_0::operator_cast_to_function_pointer(&local_1d);
    params_00->progress_callback = p_Var3;
  }
  plVar4 = (llama_model *)operator_new(0x1ac0);
  llama_model::llama_model
            ((llama_model *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),params_00)
  ;
  local_28 = plVar4;
  if (params_00->devices == (ggml_backend_dev_t *)0x0) {
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::vector
              ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)0x3a97ad);
    local_60 = (ggml_backend_device **)0x0;
    while (__first._M_current = local_60,
          __position._M_current = (ggml_backend_device **)ggml_backend_dev_count(),
          __first._M_current < __position._M_current) {
      in_stack_fffffffffffffed8._M_current = (ggml_backend_device **)ggml_backend_dev_get(local_60);
      local_68 = in_stack_fffffffffffffed8._M_current;
      in_stack_fffffffffffffed4 = ggml_backend_dev_type(in_stack_fffffffffffffed8._M_current);
      if ((in_stack_fffffffffffffed4 != 0) && (in_stack_fffffffffffffed4 == 1)) {
        __s = (char *)ggml_backend_dev_backend_reg(local_68);
        local_70 = __s;
        __a = (allocator<char> *)ggml_backend_reg_name(__s);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),__s,__a);
        bVar1 = std::operator==((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ),in_stack_fffffffffffffe88);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        if (bVar1) {
          std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
        else {
          std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
      }
      local_60 = (ggml_backend_device **)((long)local_60 + 1);
    }
    bVar1 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::empty
                      (in_stack_fffffffffffffea0);
    if (!bVar1) {
      in_stack_fffffffffffffea0 = &local_28->devices;
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::begin
                ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 in_stack_fffffffffffffe88);
      __gnu_cxx::
      __normal_iterator<ggml_backend_device*const*,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>
      ::__normal_iterator<ggml_backend_device**>
                ((__normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                  *)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe98 = local_58;
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::begin
                ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 in_stack_fffffffffffffe88);
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::end
                ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 in_stack_fffffffffffffe88);
      local_c0 = (ggml_backend_device **)
                 std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
                 insert<__gnu_cxx::__normal_iterator<ggml_backend_device**,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>,void>
                           ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *
                            )CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            __position,__first,in_stack_fffffffffffffed8);
    }
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::~vector
              (in_stack_fffffffffffffea0);
  }
  else {
    for (local_40 = params_00->devices; *local_40 != (ggml_backend_dev_t)0x0;
        local_40 = local_40 + 1) {
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
  }
  if (params_00->split_mode == LLAMA_SPLIT_MODE_NONE) {
    if (-1 < params_00->main_gpu) {
      in_stack_fffffffffffffe94 = params_00->main_gpu;
      sVar5 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::size
                        (&local_28->devices);
      if (in_stack_fffffffffffffe94 < (int)sVar5) {
        ppgVar6 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::
                  operator[](&local_28->devices,(long)params_00->main_gpu);
        local_c8 = *ppgVar6;
        std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::clear
                  ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)0x3a9b45
                  );
        std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        goto LAB_003a9b61;
      }
    }
    uVar9 = params_00->main_gpu;
    sVar5 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::size
                      (&local_28->devices);
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: invalid value for main_gpu: %d (available devices: %d)\n",
                       "llama_model_load_from_file_impl",(ulong)uVar9,sVar5 & 0xffffffff);
    llama_model_free((llama_model *)CONCAT44(in_stack_fffffffffffffe94,uVar9));
    local_8 = (llama_model *)0x0;
  }
  else {
LAB_003a9b61:
    local_d0 = &local_28->devices;
    local_d8._M_current =
         (ggml_backend_device **)
         std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::begin
                   ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                    in_stack_fffffffffffffe88);
    local_e0 = (ggml_backend_device **)
               std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::end
                         ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                          in_stack_fffffffffffffe88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                               *)in_stack_fffffffffffffe88), bVar1) {
      ppgVar7 = __gnu_cxx::
                __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                ::operator*(&local_d8);
      local_e8 = *ppgVar7;
      ggml_backend_dev_memory(local_e8,&local_f0,local_f8);
      in_stack_fffffffffffffe88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ggml_backend_dev_name(local_e8);
      uVar8 = ggml_backend_dev_description(local_e8);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: using device %s (%s) - %zu MiB free\n",
                         "llama_model_load_from_file_impl",in_stack_fffffffffffffe88,uVar8,
                         local_f0 >> 0x14);
      __gnu_cxx::
      __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
      ::operator++(&local_d8);
    }
    iVar2 = llama_model_load(in_stack_00000158,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)model,in_stack_00000148,in_stack_00000140);
    if (0 < iVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama.cpp"
                 ,0xd4,"GGML_ASSERT(%s) failed","status <= 0");
    }
    if (iVar2 < 0) {
      if (iVar2 == -1) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to load model\n",
                           "llama_model_load_from_file_impl");
      }
      else if (iVar2 == -2) {
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: cancelled model load\n",
                           "llama_model_load_from_file_impl");
      }
      llama_model_free((llama_model *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
      ;
      local_8 = (llama_model *)0x0;
    }
    else {
      local_8 = local_28;
    }
  }
  return local_8;
}

Assistant:

static struct llama_model * llama_model_load_from_file_impl(
        const std::string & path_model,
        std::vector<std::string> & splits,
        struct llama_model_params params) {
    ggml_time_init();

    unsigned cur_percentage = 0;
    if (params.progress_callback == NULL) {
        params.progress_callback_user_data = &cur_percentage;
        params.progress_callback = [](float progress, void * ctx) {
            unsigned * cur_percentage_p = (unsigned *) ctx;
            unsigned percentage = (unsigned) (100 * progress);
            while (percentage > *cur_percentage_p) {
                *cur_percentage_p = percentage;
                LLAMA_LOG_CONT(".");
                if (percentage >= 100) {
                    LLAMA_LOG_CONT("\n");
                }
            }
            return true;
        };
    }

    llama_model * model = new llama_model(params);

    // create list of devices to use with this model
    if (params.devices) {
        for (ggml_backend_dev_t * dev = params.devices; *dev; ++dev) {
            model->devices.push_back(*dev);
        }
    } else {
        std::vector<ggml_backend_dev_t> rpc_servers;
        // use all available devices
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            switch (ggml_backend_dev_type(dev)) {
                case GGML_BACKEND_DEVICE_TYPE_CPU:
                case GGML_BACKEND_DEVICE_TYPE_ACCEL:
                    // skip CPU backends since they are handled separately
                    break;

                case GGML_BACKEND_DEVICE_TYPE_GPU:
                    ggml_backend_reg_t reg = ggml_backend_dev_backend_reg(dev);
                    if (ggml_backend_reg_name(reg) == std::string("RPC")) {
                        rpc_servers.push_back(dev);
                    } else {
                        model->devices.push_back(dev);
                    }
                    break;
            }
        }
        // add RPC servers at the front of the list
        if (!rpc_servers.empty()) {
            model->devices.insert(model->devices.begin(), rpc_servers.begin(), rpc_servers.end());
        }
    }

    // if using single GPU mode, remove all except the main GPU
    if (params.split_mode == LLAMA_SPLIT_MODE_NONE) {
        if (params.main_gpu < 0 || params.main_gpu >= (int)model->devices.size()) {
            LLAMA_LOG_ERROR("%s: invalid value for main_gpu: %d (available devices: %d)\n", __func__, params.main_gpu, (int)model->devices.size());
            llama_model_free(model);
            return nullptr;
        }
        ggml_backend_dev_t main_gpu = model->devices[params.main_gpu];
        model->devices.clear();
        model->devices.push_back(main_gpu);
    }

    for (auto * dev : model->devices) {
        size_t free, total; // NOLINT
        ggml_backend_dev_memory(dev, &free, &total);
        LLAMA_LOG_INFO("%s: using device %s (%s) - %zu MiB free\n", __func__, ggml_backend_dev_name(dev), ggml_backend_dev_description(dev), free/1024/1024);
    }

    const int status = llama_model_load(path_model, splits, *model, params);
    GGML_ASSERT(status <= 0);
    if (status < 0) {
        if (status == -1) {
            LLAMA_LOG_ERROR("%s: failed to load model\n", __func__);
        } else if (status == -2) {
            LLAMA_LOG_INFO("%s: cancelled model load\n", __func__);
        }

        llama_model_free(model);
        return nullptr;
    }

    return model;
}